

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

Tim_Man_t * Tim_ManReduce(Tim_Man_t *p,Vec_Int_t *vBoxesLeft,int nTermsDiff)

{
  uint uVar1;
  Tim_Obj_t *pTVar2;
  Tim_Obj_t *pTVar3;
  float *pfVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
    iVar7 = p->nCis;
  }
  else {
    iVar7 = Tim_ManBoxOutputFirst(p,0);
  }
  iVar8 = Tim_ManPoNum(p);
  uVar18 = vBoxesLeft->nSize;
  pVVar11 = p->vBoxes;
  if (pVVar11 == (Vec_Ptr_t *)0x0) {
    iVar19 = 0;
  }
  else {
    iVar19 = pVVar11->nSize;
  }
  if (iVar19 < (int)uVar18) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x107,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  iVar7 = iVar7 - nTermsDiff;
  iVar8 = iVar8 - nTermsDiff;
  iVar17 = iVar7;
  iVar19 = iVar8;
  if (0 < (int)uVar18) {
    uVar15 = 0;
    do {
      iVar9 = vBoxesLeft->pArray[uVar15];
      if (((long)iVar9 < 0) || (pVVar11->nSize <= iVar9)) goto LAB_0041c092;
      iVar17 = iVar17 + *(int *)((long)pVVar11->pArray[iVar9] + 0xc);
      iVar19 = iVar19 + *(int *)((long)pVVar11->pArray[iVar9] + 8);
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  uVar18 = p->nCis;
  if ((int)(uVar18 - nTermsDiff) < iVar17) {
    __assert_fail("nNewCis <= Tim_ManCiNum(p) - nTermsDiff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x111,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  uVar1 = p->nCos;
  if ((int)(uVar1 - nTermsDiff) < iVar19) {
    __assert_fail("nNewCos <= Tim_ManCoNum(p) - nTermsDiff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x112,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  if ((0 < (int)uVar18) && (pTVar2 = p->pCis, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      *(undefined4 *)((long)&pTVar2->TravId + lVar16) = 0;
      lVar16 = lVar16 + 0x18;
    } while ((ulong)uVar18 * 0x18 != lVar16);
  }
  if ((0 < (int)uVar1) && (pTVar2 = p->pCos, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      *(undefined4 *)((long)&pTVar2->TravId + lVar16) = 0;
      lVar16 = lVar16 + 0x18;
    } while ((ulong)uVar1 * 0x18 != lVar16);
  }
  p_00 = Tim_ManStart(iVar17,iVar19);
  memcpy(p_00->pCis,p->pCis,(long)iVar7 * 0x18);
  pTVar2 = p_00->pCos;
  iVar17 = p->nCos;
  pTVar3 = p->pCos;
  iVar9 = Tim_ManPoNum(p);
  memcpy(pTVar2 + ((long)iVar19 - (long)iVar8),pTVar3 + ((long)iVar17 - (long)iVar9),
         (long)iVar8 * 0x18);
  pVVar11 = p->vDelayTables;
  if ((pVVar11 != (Vec_Ptr_t *)0x0) && (0 < pVVar11->nSize)) {
    iVar19 = pVVar11->nSize;
    pVVar11 = (Vec_Ptr_t *)malloc(0x10);
    iVar17 = 8;
    if (6 < iVar19 - 1U) {
      iVar17 = iVar19;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = iVar17;
    if (iVar17 == 0) {
      ppvVar12 = (void **)0x0;
    }
    else {
      ppvVar12 = (void **)malloc((long)iVar17 << 3);
    }
    pVVar11->pArray = ppvVar12;
    pVVar11->nSize = iVar19;
    bVar6 = false;
    memset(ppvVar12,0,(long)iVar19 << 3);
    p_00->vDelayTables = pVVar11;
    pVVar11 = p->vDelayTables;
    if (0 < pVVar11->nSize) {
      uVar15 = 0;
      do {
        pfVar4 = (float *)pVVar11->pArray[uVar15];
        if (pfVar4 != (float *)0x0) {
          if (!bVar6 && uVar15 != (uint)(int)*pfVar4) {
            puts("Warning: Mismatch in delay-table number between the manager and the box.");
            bVar6 = true;
          }
          uVar18 = (int)pfVar4[2] * (int)pfVar4[1];
          pfVar13 = (float *)malloc((long)(int)uVar18 * 4 + 0xc);
          *pfVar13 = (float)(int)uVar15;
          pfVar13[1] = (float)(int)pfVar4[1];
          pfVar13[2] = (float)(int)pfVar4[2];
          if (0 < (int)uVar18) {
            uVar14 = 0;
            do {
              pfVar13[uVar14 + 3] = pfVar4[uVar14 + 3];
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
          if ((long)p_00->vDelayTables->nSize <= (long)uVar15) goto LAB_0041c092;
          ppvVar12 = p_00->vDelayTables->pArray;
          if (ppvVar12[uVar15] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0x137,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
          }
          ppvVar12[uVar15] = pfVar13;
        }
        uVar15 = uVar15 + 1;
        pVVar11 = p->vDelayTables;
      } while ((long)uVar15 < (long)pVVar11->nSize);
    }
  }
  pVVar11 = p->vBoxes;
  if ((pVVar11 != (Vec_Ptr_t *)0x0) && (0 < pVVar11->nSize)) {
    if (pVVar11 == (Vec_Ptr_t *)0x0) {
      iVar19 = 0;
    }
    else {
      iVar19 = pVVar11->nSize;
    }
    pVVar11 = (Vec_Ptr_t *)malloc(0x10);
    iVar17 = 8;
    if (6 < iVar19 - 1U) {
      iVar17 = iVar19;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = iVar17;
    iVar19 = 0;
    if (iVar17 == 0) {
      ppvVar12 = (void **)0x0;
    }
    else {
      ppvVar12 = (void **)malloc((long)iVar17 << 3);
    }
    pVVar11->pArray = ppvVar12;
    p_00->vBoxes = pVVar11;
    if (0 < vBoxesLeft->nSize) {
      lVar16 = 0;
      iVar19 = 0;
      do {
        iVar17 = vBoxesLeft->pArray[lVar16];
        if (((long)iVar17 < 0) || (p->vBoxes->nSize <= iVar17)) {
LAB_0041c092:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = p->vBoxes->pArray[iVar17];
        Tim_ManCreateBox(p_00,iVar19,*(int *)((long)pvVar5 + 8),iVar7,*(int *)((long)pvVar5 + 0xc),
                         *(int *)((long)pvVar5 + 0x10),*(int *)((long)pvVar5 + 0x18));
        if (p_00->vBoxes == (Vec_Ptr_t *)0x0) {
          iVar9 = -1;
        }
        else {
          iVar9 = p_00->vBoxes->nSize + -1;
        }
        iVar10 = Tim_ManBoxCopy(p,iVar17);
        if (iVar10 != -1) {
          iVar17 = Tim_ManBoxCopy(p,iVar17);
        }
        Tim_ManBoxSetCopy(p_00,iVar9,iVar17);
        iVar7 = iVar7 + *(int *)((long)pvVar5 + 0xc);
        iVar19 = iVar19 + *(int *)((long)pvVar5 + 8);
        lVar16 = lVar16 + 1;
      } while (lVar16 < vBoxesLeft->nSize);
    }
    if (iVar7 != p_00->nCis) {
      __assert_fail("curPi == Tim_ManCiNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x14a,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
    if (iVar19 + iVar8 != p_00->nCos) {
      __assert_fail("curPo == Tim_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x14b,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManReduce( Tim_Man_t * p, Vec_Int_t * vBoxesLeft, int nTermsDiff )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, iBox, nNewCis, nNewCos, nInputs, nOutputs;
    int nNewPiNum = Tim_ManPiNum(p) - nTermsDiff;
    int nNewPoNum = Tim_ManPoNum(p) - nTermsDiff;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = nNewPiNum;
    nNewCos = nNewPoNum;
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        pBox = Tim_ManBox( p, iBox );
        nNewCis += pBox->nOutputs;
        nNewCos += pBox->nInputs;
    }
    assert( nNewCis <= Tim_ManCiNum(p) - nTermsDiff );
    assert( nNewCos <= Tim_ManCoNum(p) - nTermsDiff );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * nNewPiNum );
    memcpy( pNew->pCos + nNewCos - nNewPoNum, 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * nNewPoNum );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        int fWarning = 0;
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            if ( i != (int)pDelayTable[0] && fWarning == 0 )
            {
                printf( "Warning: Mismatch in delay-table number between the manager and the box.\n" );
                fWarning = 1;
            }
            //assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = i;//(int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = nNewPiNum;
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Vec_IntForEachEntry( vBoxesLeft, iBox, i )
        {
            pBox = Tim_ManBox( p, iBox );
            Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
            Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, iBox) == -1 ? iBox : Tim_ManBoxCopy(p, iBox) );
            curPi += pBox->nOutputs;
            curPo += pBox->nInputs;
        }
        curPo += nNewPoNum;
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}